

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-sig-verifier.c
# Opt level: O0

void ndn_sig_verifier_after_bootstrapping(ndn_face_intf_t *face)

{
  ndn_key_storage_t *pnVar1;
  int local_1dc;
  int i;
  ndn_key_storage_t *storage;
  ndn_name_t prefix;
  ndn_face_intf_t *face_local;
  
  m_sig_verifier_state.face = face;
  prefix._436_8_ = face;
  pnVar1 = ndn_key_storage_get_instance();
  for (local_1dc = 0; local_1dc < 3; local_1dc = local_1dc + 1) {
    if (pnVar1->self_identity_key[local_1dc].key_id != 0xffffffff) {
      memcpy((void *)((long)&storage + 4),pnVar1->self_identity + local_1dc,0x1bc);
      printf("DEBUG: %s, L%d: ","ndn_sig_verifier_after_bootstrapping",0x98);
      printf("[SIGVERIFIER] SigVerifier register prefix for: ");
      ndn_name_print((ndn_name_t *)((long)&storage + 4));
      ndn_forwarder_register_name_prefix
                ((ndn_name_t *)((long)&storage + 4),sig_verifier_on_interest,(void *)0x0);
    }
  }
  return;
}

Assistant:

void
ndn_sig_verifier_after_bootstrapping(ndn_face_intf_t* face)
{
  m_sig_verifier_state.face = face;
  ndn_name_t prefix;
  ndn_key_storage_t* storage = ndn_key_storage_get_instance();
  for (int i = 0; i < NDN_SEC_CERT_SIZE; i++) {
    if (storage->self_identity_key[i].key_id != NDN_SEC_INVALID_KEY_ID) {
      memcpy(&prefix, &storage->self_identity[i], sizeof(ndn_name_t));
      NDN_LOG_DEBUG("[SIGVERIFIER] SigVerifier register prefix for: ");
      NDN_LOG_DEBUG_NAME(&prefix);
      ndn_forwarder_register_name_prefix(&prefix, sig_verifier_on_interest, NULL);
    }
  }
}